

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void do_atomic_op_i32(TCGContext_conflict9 *tcg_ctx,TCGv_i32 ret,TCGv_i32 addr,TCGv_i32 val,
                     TCGArg idx,MemOp memop,void **table)

{
  code *pcVar1;
  MemOp opc;
  TCGv_i32 pTVar2;
  uintptr_t o;
  
  opc = tcg_canonicalize_memop(memop,false,false);
  pcVar1 = (code *)table[opc & MO_BEQ];
  pTVar2 = tcg_const_i32_tricore(tcg_ctx,(opc & 0xffffffb) << 4 | (uint)idx);
  (*pcVar1)(tcg_ctx,ret,tcg_ctx->cpu_env,addr,val,pTVar2);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  if ((opc & MO_ASHIFT) == MO_8) {
    return;
  }
  tcg_gen_ext_i32(tcg_ctx,ret,ret,opc);
  return;
}

Assistant:

static void do_atomic_op_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv addr, TCGv_i32 val,
                             TCGArg idx, MemOp memop, void * const table[])
{
    gen_atomic_op_i32 gen;

    memop = tcg_canonicalize_memop(memop, 0, 0);

    gen = table[memop & (MO_SIZE | MO_BSWAP)];
    tcg_debug_assert(gen != NULL);

    {
        TCGv_i32 oi = tcg_const_i32(tcg_ctx, make_memop_idx(memop & ~MO_SIGN, idx));
        gen(tcg_ctx, ret, tcg_ctx->cpu_env, addr, val, oi);
        tcg_temp_free_i32(tcg_ctx, oi);
    }

    if (memop & MO_SIGN) {
        tcg_gen_ext_i32(tcg_ctx, ret, ret, memop);
    }
}